

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_multi_statemach(connectdata *conn,_Bool *done)

{
  Curl_easy *pCVar1;
  tftp_state_data_t *state;
  tftp_state_data_t *state_00;
  socklen_t sVar2;
  CURLcode CVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  char *pcVar7;
  ssize_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  tftp_event_t tVar13;
  undefined8 uVar14;
  ushort *puVar15;
  ulong uVar16;
  ushort *puVar17;
  ulong maxlen;
  bool bVar18;
  socklen_t local_c4;
  long local_c0;
  ushort *local_b8;
  Curl_sockaddr_storage fromaddr;
  
  pCVar1 = conn->data;
  state = (conn->proto).tftpc;
  time((time_t *)&fromaddr);
  lVar12 = state->max_time;
  if (lVar12 < (long)fromaddr.buffer._0_8_) {
    state->error = TFTP_ERR_TIMEOUT;
    state->state = TFTP_STATE_FIN;
    *done = false;
  }
  else if ((long)state->retry_time + state->rx_time < (long)fromaddr.buffer._0_8_) {
    time(&state->rx_time);
    lVar12 = state->max_time;
    *done = false;
    if ((long)fromaddr.buffer._0_8_ < lVar12) {
      tVar13 = TFTP_EVENT_TIMEOUT;
LAB_0012e3c1:
      CVar3 = tftp_state_machine(state,tVar13);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      bVar18 = state->state == TFTP_STATE_FIN;
      *done = bVar18;
      if (!bVar18) {
        return CURLE_OK;
      }
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      return CURLE_OK;
    }
  }
  else {
    *done = false;
    if ((long)fromaddr.buffer._0_8_ < lVar12) {
      iVar4 = Curl_socket_check(state->sockfd,-1,-1,0);
      if (iVar4 == 0) {
        return CURLE_OK;
      }
      if (iVar4 == -1) {
        piVar6 = __errno_location();
        pcVar7 = Curl_strerror(conn,*piVar6);
        Curl_failf(pCVar1,"%s",pcVar7);
        state->event = TFTP_EVENT_ERROR;
        return CURLE_OK;
      }
      pCVar1 = conn->data;
      state_00 = (conn->proto).tftpc;
      local_c4 = 0x80;
      sVar8 = recvfrom(state_00->sockfd,(state_00->rpacket).data,(long)state_00->blksize + 4,0,
                       (sockaddr *)&fromaddr,&local_c4);
      sVar2 = local_c4;
      uVar5 = (uint)sVar8;
      state_00->rbytes = uVar5;
      if (state_00->remote_addrlen == 0) {
        memcpy(&state_00->remote_addr,&fromaddr,(ulong)local_c4);
        state_00->remote_addrlen = sVar2;
        uVar5 = state_00->rbytes;
      }
      if ((int)uVar5 < 4) {
        Curl_failf(pCVar1,"Received too short packet");
        state_00->event = TFTP_EVENT_TIMEOUT;
      }
      else {
        puVar15 = (ushort *)(state_00->rpacket).data;
        tVar13 = (tftp_event_t)(ushort)(*puVar15 << 8 | *puVar15 >> 8);
        state_00->event = tVar13;
        switch(tVar13) {
        case TFTP_EVENT_DATA:
          if ((uVar5 != 4) &&
             ((ushort)((short)*(undefined4 *)&state_00->block + 1U) ==
              (ushort)(puVar15[1] << 8 | puVar15[1] >> 8))) {
            CVar3 = Curl_client_write(conn,1,(char *)(puVar15 + 2),(ulong)(uVar5 - 4));
            if (CVar3 != CURLE_OK) {
              tftp_state_machine(state_00,TFTP_EVENT_ERROR);
              return CVar3;
            }
            lVar12 = (long)state_00->rbytes + (pCVar1->req).bytecount + -4;
            (pCVar1->req).bytecount = lVar12;
            Curl_pgrsSetDownloadCounter(pCVar1,lVar12);
          }
          break;
        case TFTP_EVENT_ACK:
          break;
        case TFTP_EVENT_ERROR:
          state_00->error = (uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8);
          Curl_infof(pCVar1,"%s\n",puVar15 + 2);
          break;
        case TFTP_EVENT_OACK:
          pCVar1 = state_00->conn->data;
          state_00->blksize = 0x200;
          local_b8 = (ushort *)((long)puVar15 + (ulong)uVar5);
          puVar15 = puVar15 + 1;
          while (puVar15 < local_b8) {
            maxlen = (long)local_b8 - (long)puVar15;
            sVar9 = Curl_strnlen((char *)puVar15,maxlen);
            uVar16 = sVar9 + 1;
            if (maxlen < uVar16 || maxlen - uVar16 == 0) {
LAB_0012e7a8:
              pcVar7 = "Malformed ACK packet, rejecting";
LAB_0012e7b8:
              Curl_failf(pCVar1,pcVar7);
              return CURLE_TFTP_ILLEGAL;
            }
            sVar10 = Curl_strnlen((char *)(uVar16 + (long)puVar15),maxlen - uVar16);
            uVar16 = sVar9 + sVar10 + 2;
            if (maxlen < uVar16) goto LAB_0012e7a8;
            sVar11 = strlen((char *)puVar15);
            pcVar7 = (char *)((long)puVar15 + sVar11 + 1);
            puVar17 = (ushort *)(uVar16 + (long)puVar15);
            Curl_infof(pCVar1,"got option=(%s) value=(%s)\n",puVar15);
            sVar11 = strlen((char *)puVar15);
            iVar4 = curl_strnequal((char *)puVar15,"blksize",sVar11);
            if (iVar4 == 0) {
              sVar11 = strlen((char *)puVar15);
              iVar4 = curl_strnequal((char *)puVar15,"tsize",sVar11);
              puVar15 = puVar17;
              if (iVar4 != 0) {
                local_c0 = strtol(pcVar7,(char **)0x0,10);
                Curl_infof(pCVar1,"%s (%ld)\n","tsize parsed from OACK");
                if ((pCVar1->set).upload == false) {
                  if (local_c0 == 0) {
                    Curl_failf(pCVar1,"invalid tsize -:%s:- value in OACK packet",pcVar7);
                    return CURLE_TFTP_ILLEGAL;
                  }
                  Curl_pgrsSetDownloadSize(pCVar1,local_c0);
                }
              }
            }
            else {
              lVar12 = strtol(pcVar7,(char **)0x0,10);
              if (lVar12 == 0) {
                pcVar7 = "invalid blocksize value in OACK packet";
                goto LAB_0012e7b8;
              }
              if (0xffb8 < lVar12) {
                pcVar7 = "blksize is larger than max supported";
                uVar14 = 0xffb8;
LAB_0012e7f6:
                Curl_failf(pCVar1,"%s (%d)",pcVar7,uVar14);
                return CURLE_TFTP_ILLEGAL;
              }
              if (lVar12 < 8) {
                pcVar7 = "blksize is smaller than min supported";
                uVar14 = 8;
                goto LAB_0012e7f6;
              }
              if (state_00->requested_blksize < lVar12) {
                Curl_failf(pCVar1,"%s (%ld)","server requested blksize larger than allocated",lVar12
                          );
                return CURLE_TFTP_ILLEGAL;
              }
              state_00->blksize = (int)lVar12;
              Curl_infof(pCVar1,"%s (%d) %s (%d)\n","blksize parsed from OACK");
              puVar15 = puVar17;
            }
          }
          break;
        default:
          Curl_failf(pCVar1,"%s","Internal error: Unexpected packet");
        }
        iVar4 = Curl_pgrsUpdate(conn);
        if (iVar4 != 0) {
          tftp_state_machine(state_00,TFTP_EVENT_ERROR);
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      tVar13 = state->event;
      goto LAB_0012e3c1;
    }
  }
  Curl_failf(pCVar1,"TFTP response timeout");
  return CURLE_OPERATION_TIMEDOUT;
}

Assistant:

static CURLcode tftp_multi_statemach(struct connectdata *conn, bool *done)
{
  int                   rc;
  tftp_event_t          event;
  CURLcode              result = CURLE_OK;
  struct Curl_easy  *data = conn->data;
  tftp_state_data_t     *state = (tftp_state_data_t *)conn->proto.tftpc;
  long                  timeout_ms = tftp_state_timeout(conn, &event);

  *done = FALSE;

  if(timeout_ms <= 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  else if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
    if(*done)
      /* Tell curl we're done */
      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
  }
  else {
    /* no timeouts to handle, check our socket */
    rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      failf(data, "%s", Curl_strerror(conn, error));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc != 0) {
      result = tftp_receive_packet(conn);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
      if(*done)
        /* Tell curl we're done */
        Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}